

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_buffered_batch_collector.cpp
# Opt level: O1

SinkCombineResultType __thiscall
duckdb::PhysicalBufferedBatchCollector::Combine
          (PhysicalBufferedBatchCollector *this,ExecutionContext *context,
          OperatorSinkCombineInput *input)

{
  GlobalSinkState *pGVar1;
  idx_t min_batch_index;
  BufferedData *this_00;
  BatchedBufferedData *this_01;
  
  pGVar1 = input->global_state;
  min_batch_index = optional_idx::GetIndex(&(input->local_state->partition_info).min_batch_index);
  this_00 = shared_ptr<duckdb::BufferedData,_true>::operator->
                      ((shared_ptr<duckdb::BufferedData,_true> *)
                       &pGVar1[1].super_StateWithBlockableTasks.lock);
  this_01 = BufferedData::Cast<duckdb::BatchedBufferedData>(this_00);
  BatchedBufferedData::UpdateMinBatchIndex(this_01,min_batch_index);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalBufferedBatchCollector::Combine(ExecutionContext &context,
                                                              OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<BufferedBatchCollectorGlobalState>();
	auto &lstate = input.local_state.Cast<BufferedBatchCollectorLocalState>();

	auto min_batch_index = lstate.partition_info.min_batch_index.GetIndex();
	auto &buffered_data = gstate.buffered_data->Cast<BatchedBufferedData>();

	// FIXME: this can move from the buffer to the read queue, increasing the 'read_queue_byte_count'
	// We might want to block here if 'read_queue_byte_count' has already reached the ReadQueueCapacity()
	// So we don't completely disregard the 'streaming_buffer_size' that was set
	buffered_data.UpdateMinBatchIndex(min_batch_index);
	return SinkCombineResultType::FINISHED;
}